

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

void __thiscall
cfd::core::ConfidentialTxIn::ConfidentialTxIn
          (ConfidentialTxIn *this,Txid *txid,uint32_t index,uint32_t sequence,
          Script *unlocking_script)

{
  AbstractTxIn::AbstractTxIn(&this->super_AbstractTxIn,txid,index,sequence,unlocking_script);
  (this->super_AbstractTxIn)._vptr_AbstractTxIn = (_func_int **)&PTR__ConfidentialTxIn_0068de68;
  ByteData256::ByteData256(&this->blinding_nonce_);
  ByteData256::ByteData256(&this->asset_entropy_);
  (this->issuance_amount_)._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_0068d0c0;
  ByteData::ByteData(&(this->issuance_amount_).data_);
  (this->issuance_amount_).version_ = '\0';
  (this->inflation_keys_)._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_0068d0c0;
  ByteData::ByteData(&(this->inflation_keys_).data_);
  (this->inflation_keys_).version_ = '\0';
  ByteData::ByteData(&this->issuance_amount_rangeproof_);
  ByteData::ByteData(&this->inflation_keys_rangeproof_);
  (this->pegin_witness_)._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_0067f138;
  (this->pegin_witness_).witness_stack_.
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pegin_witness_).witness_stack_.
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pegin_witness_).witness_stack_.
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

ConfidentialTxIn::ConfidentialTxIn(
    const Txid &txid, uint32_t index, uint32_t sequence,
    const Script &unlocking_script)
    : AbstractTxIn(txid, index, sequence, unlocking_script),
      blinding_nonce_(),
      asset_entropy_(),
      issuance_amount_(),
      inflation_keys_(),
      issuance_amount_rangeproof_(),
      inflation_keys_rangeproof_(),
      pegin_witness_() {
  // do nothing
}